

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void dummy_Op_InitClassMemberSet(void)

{
  return;
}

Assistant:

Js::PropertyId JavascriptOperators::OP_InitElemSetter(Var object, Var elementName, Var setter, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(OP_InitElemSetter);
        AssertMsg(!TaggedNumber::Is(object), "SetMember on a non-object?");

        PropertyId propertyId = JavascriptOperators::GetPropertyId(elementName, scriptContext);

        VarTo<RecyclableObject>(object)->SetAccessors(propertyId, nullptr, setter);

        return propertyId;
        JIT_HELPER_END(OP_InitElemSetter);
    }